

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  size_t sVar3;
  void *pvVar4;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  undefined4 local_3ac;
  ParseError *e;
  string local_398;
  allocator local_371;
  string local_370;
  double local_350;
  double value;
  string local_340;
  allocator local_319;
  string local_318;
  Option *local_2f8;
  Option *flag;
  int v;
  allocator local_2c1;
  string local_2c0;
  Option *local_2a0;
  Option *copt;
  int count;
  allocator local_269;
  string local_268;
  Option *local_248;
  Option *opt;
  string file;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_ptr_ = (Option *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"K3Pi goofit fitter",&local_209);
  CLI::App::App((App *)local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::string((string *)&opt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"-f,--file,file",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&count,"File name",(allocator *)((long)&copt + 7));
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ((App *)local_1e8,&local_268,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                      (string *)&count);
  std::__cxx11::string::~string((string *)&count);
  std::allocator<char>::~allocator((allocator<char> *)((long)&copt + 7));
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  local_248 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"-c,--count",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&v,"Counter",(allocator *)((long)&flag + 7));
  pOVar1 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     ((App *)local_1e8,&local_2c0,(int *)&copt,(string *)&v);
  std::__cxx11::string::~string((string *)&v);
  std::allocator<char>::~allocator((allocator<char> *)((long)&flag + 7));
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  local_2a0 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"--flag",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_340,"Some flag that can be passed multiple times",
             (allocator *)((long)&value + 7));
  pOVar1 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     ((App *)local_1e8,&local_318,(int *)&flag,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  local_2f8 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"-d,--double",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"Some Value",(allocator *)((long)&e + 7));
  CLI::App::add_option<double,_(CLI::detail::enabler)0>
            ((App *)local_1e8,&local_370,&local_350,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  CLI::App::parse((App *)local_1e8,argc,(char **)app.config_ptr_);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on file: ");
  poVar2 = std::operator<<(poVar2,(string *)&opt);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"--file",&local_3d1);
  sVar3 = CLI::App::count((App *)local_1e8,&local_3d0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,", opt count: ");
  sVar3 = CLI::Option::count(local_248);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on count: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)copt);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"--count",&local_3f9);
  sVar3 = CLI::App::count((App *)local_1e8,&local_3f8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,", opt count: ");
  sVar3 = CLI::Option::count(local_2a0);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  poVar2 = std::operator<<((ostream *)&std::cout,"Recieved flag: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)flag);
  poVar2 = std::operator<<(poVar2," (");
  sVar3 = CLI::Option::count(local_2f8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,") times\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Some value: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar2,local_350);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_3ac = 1;
  std::__cxx11::string::~string((string *)&opt);
  CLI::App::~App((App *)local_1e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name");

    int count;
    CLI::Option *copt = app.add_option("-c,--count", count, "Counter");

    int v;
    CLI::Option *flag = app.add_flag("--flag", v, "Some flag that can be passed multiple times");

    double value; // = 3.14;
    app.add_option("-d,--double", value, "Some Value");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << std::endl;
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << std::endl;
    std::cout << "Recieved flag: " << v << " (" << flag->count() << ") times\n";
    std::cout << "Some value: " << value << std::endl;

    return 0;
}